

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O0

void ecs_query_notify(ecs_world_t *world,ecs_query_t *query,ecs_query_event_t *event)

{
  bool bVar1;
  _Bool _Var2;
  _Bool notify;
  ecs_query_event_t *event_local;
  ecs_query_t *query_local;
  ecs_world_t *world_local;
  
  bVar1 = true;
  switch(event->kind) {
  case EcsQueryTableMatch:
    _Var2 = match_table(world,query,event->table);
    if ((_Var2) && (query->subqueries != (ecs_vector_t *)0x0)) {
      notify_subqueries(world,query,event);
    }
    bVar1 = false;
    break;
  case EcsQueryTableEmpty:
    activate_table(world,query,event->table,false);
    break;
  case EcsQueryTableNonEmpty:
    activate_table(world,query,event->table,true);
    break;
  case EcsQueryTableRematch:
    rematch_tables(world,query,event->parent_query);
    break;
  case EcsQueryTableUnmatch:
    unmatch_table(query,event->table,(ecs_table_indices_t *)0x0);
    break;
  case EcsQueryOrphan:
    _ecs_assert((query->flags & 0x100) != 0,0xc,(char *)0x0,"query->flags & EcsQueryIsSubquery",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                ,0x86b);
    if ((query->flags & 0x100) == 0) {
      __assert_fail("query->flags & (256)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                    ,0x86b,
                    "void ecs_query_notify(ecs_world_t *, ecs_query_t *, ecs_query_event_t *)");
    }
    query->flags = query->flags | 0x200;
    query->parent = (ecs_query_t *)0x0;
  }
  if (bVar1) {
    notify_subqueries(world,query,event);
  }
  return;
}

Assistant:

void ecs_query_notify(
    ecs_world_t *world,
    ecs_query_t *query,
    ecs_query_event_t *event)
{
    bool notify = true;

    switch(event->kind) {
    case EcsQueryTableMatch:
        /* Creation of new table */
        if (match_table(world, query, event->table)) {
            if (query->subqueries) {
                notify_subqueries(world, query, event);
            }
        }
        notify = false;
        break;
    case EcsQueryTableUnmatch:
        /* Deletion of table */
        unmatch_table(query, event->table, NULL);
        break;
    case EcsQueryTableRematch:
        /* Rematch tables of query */
        rematch_tables(world, query, event->parent_query);
        break;        
    case EcsQueryTableEmpty:
        /* Table is empty, deactivate */
        activate_table(world, query, event->table, false);
        break;
    case EcsQueryTableNonEmpty:
        /* Table is non-empty, activate */
        activate_table(world, query, event->table, true);
        break;
    case EcsQueryOrphan:
        ecs_assert(query->flags & EcsQueryIsSubquery, ECS_INTERNAL_ERROR, NULL);
        query->flags |= EcsQueryIsOrphaned;
        query->parent = NULL;
        break;
    }

    if (notify) {
        notify_subqueries(world, query, event);
    }
}